

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O3

void __thiscall
TTD::ExecutionInfoManager::UpdateCurrentStatementInfo
          (ExecutionInfoManager *this,uint bytecodeOffset)

{
  int iVar1;
  FunctionBody *this_00;
  Utf8SourceInfo *pUVar2;
  StatementMap *pSVar3;
  bool bVar4;
  Type TVar5;
  int index;
  SingleCallCounter *pSVar6;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  Type *pTVar7;
  bool bVar8;
  
  pSVar6 = GetTopCallCounter(this);
  if ((bytecodeOffset < pSVar6->CurrentStatementBytecodeMin) ||
     (pSVar6->CurrentStatementBytecodeMax < bytecodeOffset)) {
    this_00 = pSVar6->Function;
    pUVar2 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    if (pUVar2 == (Utf8SourceInfo *)0x0) {
      TTDAbort_unrecoverable_error("Should always have a source info.");
    }
    if ((pUVar2->field_0xa8 & 4) == 0) {
      index = Js::FunctionBody::GetEnclosingStatementIndexFromByteCode(this_00,bytecodeOffset,true);
      this_01 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)Js::FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this_00,StatementMaps);
      pTVar7 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,index);
      pSVar3 = pTVar7->ptr;
      iVar1 = pSVar6->CurrentStatementIndex;
      bVar4 = true;
      if ((index != iVar1) && ((pSVar3->byteCodeSpan).begin <= (int)bytecodeOffset)) {
        bVar4 = (pSVar3->byteCodeSpan).end < (int)bytecodeOffset;
      }
      if (iVar1 == -1) {
        bVar8 = (pSVar3->byteCodeSpan).begin != bytecodeOffset;
      }
      else {
        bVar8 = false;
      }
      if (!(bool)(bVar4 | bVar8)) {
        pSVar6->LastStatementIndex = iVar1;
        pSVar6->LastStatementLoopTime = pSVar6->CurrentStatementLoopTime;
        pSVar6->CurrentStatementIndex = index;
        pSVar6->CurrentStatementLoopTime = pSVar6->LoopTime;
        TVar5 = (pSVar3->byteCodeSpan).end;
        pSVar6->CurrentStatementBytecodeMin = (pSVar3->byteCodeSpan).begin;
        pSVar6->CurrentStatementBytecodeMax = TVar5;
      }
    }
  }
  return;
}

Assistant:

void ExecutionInfoManager::UpdateCurrentStatementInfo(uint bytecodeOffset)
    {
        SingleCallCounter& cfinfo = this->GetTopCallCounter();

        if((cfinfo.CurrentStatementBytecodeMin <= bytecodeOffset) & (bytecodeOffset <= cfinfo.CurrentStatementBytecodeMax))
        {
            return;
        }
        else
        {
            Js::FunctionBody* fb = cfinfo.Function;
            TTDAssert(fb->GetUtf8SourceInfo() != nullptr, "Should always have a source info.");

            if (!fb->GetUtf8SourceInfo()->GetIsLibraryCode())
            {
                int32 cIndex = fb->GetEnclosingStatementIndexFromByteCode(bytecodeOffset, true);

                //We moved to a new statement
                Js::FunctionBody::StatementMap* pstmt = fb->GetStatementMaps()->Item(cIndex);
                bool newstmt = (cIndex != cfinfo.CurrentStatementIndex && pstmt->byteCodeSpan.begin <= (int)bytecodeOffset && (int)bytecodeOffset <= pstmt->byteCodeSpan.end);

                //Make sure async step back is ok -- We always step back to the first location in a statement and in most cases a function body must start at the first location in a statement.
                //However an await can be in the middle of a statment/expression and is implicitly the start of a function body. So, we must check for that case.
                bool functionBodyStartUnalignedWithStatementCase = (cfinfo.CurrentStatementIndex == -1) && (pstmt->byteCodeSpan.begin != (int)bytecodeOffset);

                if (newstmt && !functionBodyStartUnalignedWithStatementCase)
                {
                    cfinfo.LastStatementIndex = cfinfo.CurrentStatementIndex;
                    cfinfo.LastStatementLoopTime = cfinfo.CurrentStatementLoopTime;

                    cfinfo.CurrentStatementIndex = cIndex;
                    cfinfo.CurrentStatementLoopTime = cfinfo.LoopTime;

                    cfinfo.CurrentStatementBytecodeMin = (uint32)pstmt->byteCodeSpan.begin;
                    cfinfo.CurrentStatementBytecodeMax = (uint32)pstmt->byteCodeSpan.end;

#if ENABLE_FULL_BC_TRACE
                    ULONG srcLine = 0;
                    LONG srcColumn = -1;
                    uint32 startOffset = cfinfo.Function->GetFunctionBody()->GetStatementStartOffset(cfinfo.CurrentStatementIndex);
                    cfinfo.Function->GetFunctionBody()->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

                    this->m_diagnosticLogger.WriteStmtIndex((uint32)srcLine, (uint32)srcColumn);
#endif
                }
            }
        }
    }